

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfThenElseEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double __val;
  double __val_00;
  double __val_01;
  double __val_02;
  double extraout_XMM0_Qa_00;
  double __val_03;
  double __val_04;
  Variable x;
  Variable y;
  Variable local_208;
  Variable local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Expression local_f8;
  Expression local_e0;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_208);
  Kandinsky::Variable::Variable(&local_1f0);
  (local_208.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_1f0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator><Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_f8,&local_208,&local_1f0);
  Kandinsky::ifThenElse<Kandinsky::Expression,_Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_e0,&local_f8,&local_208,&local_1f0);
  (**(local_e0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_208.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_a8,__val);
  std::operator+(&local_1d8,"(",&local_a8);
  std::operator+(&local_1b8,&local_1d8," > ");
  (**((local_1f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_c8,__val_00);
  std::operator+(&local_198,&local_1b8,&local_c8);
  std::operator+(&local_178,&local_198,") ? ");
  (**((local_208.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_48,__val_01);
  std::operator+(&local_158,&local_178,&local_48);
  std::operator+(&local_138,&local_158," : ");
  (**((local_1f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_68,__val_02);
  std::operator+(&local_118,&local_138,&local_68);
  std::operator+(&local_28,&local_118," != 3");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa == 3.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_a8);
  Kandinsky::Expression::~Expression(&local_e0);
  Kandinsky::Expression::~Expression(&local_f8);
  local_a8._M_dataplus._M_p._0_4_ = 4;
  Kandinsky::operator><Kandinsky::Variable,_int,_nullptr>
            ((Expression *)&local_1d8,&local_208,(int *)&local_a8);
  local_c8._M_dataplus._M_p._0_4_ = 4;
  Kandinsky::ifThenElse<Kandinsky::Expression,_Kandinsky::Variable,_int,_nullptr>
            ((Expression *)&local_1b8,(Expression *)&local_1d8,&local_208,(int *)&local_c8);
  (*(code *)**(undefined8 **)local_1b8._M_string_length)();
  (**((local_208.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_178,__val_03);
  std::operator+(&local_158,"(",&local_178);
  std::operator+(&local_138,&local_158," > 4) ? ");
  (**((local_208.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_198,__val_04);
  std::operator+(&local_118,&local_138,&local_198);
  std::operator+(&local_88,&local_118," : 4 != 4");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_00 == 4.0) & 1),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  Kandinsky::Expression::~Expression((Expression *)&local_1b8);
  Kandinsky::Expression::~Expression((Expression *)&local_1d8);
  Kandinsky::Variable::~Variable(&local_1f0);
  Kandinsky::Variable::~Variable(&local_208);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((ifThenElse(x > y, x, y)).evaluate() == 3,
            "(" + std::to_string(x.evaluate()) + " > " + std::to_string(y.evaluate()) + ") ? "
            + std::to_string(x.evaluate()) + " : " + std::to_string(y.evaluate()) + " != 3");
    assertOrExit((ifThenElse(x > 4, x, 4)).evaluate() == 4,
            "(" + std::to_string(x.evaluate()) + " > 4) ? "
            + std::to_string(x.evaluate()) + " : 4 != 4");
    return 0;
}